

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_buffer_file(uchar *out,size_t size,char *filename)

{
  FILE *__stream;
  size_t sVar1;
  char *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  size_t readsize;
  FILE *file;
  uint local_4;
  
  __stream = fopen(in_RDX,"rb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0x4e;
  }
  else {
    sVar1 = fread(in_RDI,1,in_RSI,__stream);
    fclose(__stream);
    if (sVar1 == in_RSI) {
      local_4 = 0;
    }
    else {
      local_4 = 0x4e;
    }
  }
  return local_4;
}

Assistant:

static unsigned lodepng_buffer_file(unsigned char* out, size_t size, const char* filename)
{
  FILE* file;
  size_t readsize;
  file = fopen(filename, "rb");
  if(!file) return 78;

  readsize = fread(out, 1, size, file);
  fclose(file);

  if (readsize != size) return 78;
  return 0;
}